

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  unsigned_long uVar1;
  _GLFWwindow *window;
  int *piStack_28;
  
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (right != (int *)0x0) {
    *right = 0;
  }
  if (bottom != (int *)0x0) {
    *bottom = 0;
  }
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  piStack_28 = (int *)0x0;
  if (_glfw.x11.NET_FRAME_EXTENTS != 0) {
    uVar1 = _glfwGetWindowProperty
                      (*(Window *)(handle + 0x270),_glfw.x11.NET_FRAME_EXTENTS,6,
                       (uchar **)&piStack_28);
    if (uVar1 == 4) {
      if (left != (int *)0x0) {
        *left = *piStack_28;
      }
      if (top != (int *)0x0) {
        *top = piStack_28[4];
      }
      if (right != (int *)0x0) {
        *right = piStack_28[2];
      }
      if (bottom != (int *)0x0) {
        *bottom = piStack_28[6];
      }
    }
    if (piStack_28 != (int *)0x0) {
      XFree();
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}